

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_print_usage(nn_parse_context *ctx,FILE *stream)

{
  bool bVar1;
  int iVar2;
  nn_option *pnVar3;
  nn_option *opt;
  int first;
  int i;
  FILE *stream_local;
  nn_parse_context *ctx_local;
  
  fprintf((FILE *)stream,"    %s ",*ctx->argv);
  bVar1 = true;
  opt._4_4_ = 0;
  while (pnVar3 = ctx->options + opt._4_4_, pnVar3->longname != (char *)0x0) {
    if ((pnVar3->mask_set & ctx->requires) != 0) {
      if (bVar1) {
        bVar1 = false;
        fprintf((FILE *)stream,"{--%s",pnVar3->longname);
      }
      else {
        fprintf((FILE *)stream,"|--%s",pnVar3->longname);
      }
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  if (!bVar1) {
    fprintf((FILE *)stream,"} ");
  }
  bVar1 = true;
  opt._4_4_ = 0;
  while (pnVar3 = ctx->options + opt._4_4_, pnVar3->longname != (char *)0x0) {
    if ((((pnVar3->mask_set & ctx->requires) == 0) && (pnVar3->shortname != '\0')) &&
       (iVar2 = nn_has_arg(pnVar3), iVar2 == 0)) {
      if (bVar1) {
        bVar1 = false;
        fprintf((FILE *)stream,"[-%c",(ulong)(uint)(int)pnVar3->shortname);
      }
      else {
        fprintf((FILE *)stream,"%c",(ulong)(uint)(int)pnVar3->shortname);
      }
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  if (!bVar1) {
    fprintf((FILE *)stream,"] ");
  }
  opt._4_4_ = 0;
  while (pnVar3 = ctx->options + opt._4_4_, pnVar3->longname != (char *)0x0) {
    if (((((pnVar3->mask_set & ctx->requires) == 0) && (pnVar3->shortname != '\0')) &&
        (iVar2 = nn_has_arg(pnVar3), iVar2 != 0)) && (pnVar3->metavar != (char *)0x0)) {
      fprintf((FILE *)stream,"[-%c %s] ",(ulong)(uint)(int)pnVar3->shortname,pnVar3->metavar);
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  fprintf((FILE *)stream,"[options] \n");
  return;
}

Assistant:

static void nn_print_usage (struct nn_parse_context *ctx, FILE *stream)
{
    int i;
    int first;
    struct nn_option *opt;

    fprintf (stream, "    %s ", ctx->argv[0]);

    /* Print required options (long names)  */
    first = 1;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & ctx->requires) {
            if (first) {
                first = 0;
                fprintf (stream, "{--%s", opt->longname);
            } else {
                fprintf (stream, "|--%s", opt->longname);
            }
        }
    }
    if (!first) {
        fprintf (stream, "} ");
    }

    /* Print flag short options */
    first = 1;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & ctx->requires)
            continue;  /* already printed */
        if (opt->shortname && !nn_has_arg (opt)) {
            if (first) {
                first = 0;
                fprintf (stream, "[-%c", opt->shortname);
            } else {
                fprintf (stream, "%c", opt->shortname);
            }
        }
    }
    if (!first) {
        fprintf (stream, "] ");
    }

    /* Print short options with arguments */
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & ctx->requires)
            continue;  /* already printed */
        if (opt->shortname && nn_has_arg (opt) && opt->metavar) {
            fprintf (stream, "[-%c %s] ", opt->shortname, opt->metavar);
        }
    }

    fprintf (stream, "[options] \n");  /* There may be long options too */
}